

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O1

bool __thiscall
sentencepiece::SentencePieceProcessor::IsControl(SentencePieceProcessor *this,int id)

{
  ModelInterface *pMVar1;
  undefined1 uVar2;
  int iVar3;
  ostream *this_00;
  char *__s;
  size_t sVar4;
  Die local_29;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_28;
  
  (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
  util::Status::~Status((Status *)&local_28);
  if (local_28._M_head_impl == (Rep *)0x0) {
    pMVar1 = (this->model_)._M_t.
             super___uniq_ptr_impl<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::ModelInterface_*,_std::default_delete<sentencepiece::ModelInterface>_>
             .super__Head_base<0UL,_sentencepiece::ModelInterface_*,_false>._M_head_impl;
    iVar3 = (*pMVar1->_vptr_ModelInterface[0x13])(pMVar1,id);
    uVar2 = (undefined1)iVar3;
  }
  else {
    iVar3 = logging::GetMinLogLevel();
    if (iVar3 < 3) {
      local_29.die_ = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"sentencepiece_processor.cc",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3cf);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"LOG(",4);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"ERROR",5);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,") ",2);
      (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
      __s = util::Status::error_message((Status *)&local_28);
      if (__s == (char *)0x0) {
        std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\nReturns default value ",0x17);
      std::ostream::operator<<((ostream *)this_00,0);
      util::Status::~Status((Status *)&local_28);
      error::Die::~Die(&local_29);
    }
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool SentencePieceProcessor::IsControl(int id) const {
  CHECK_STATUS_OR_RETURN_DEFAULT(0);
  return model_->IsControl(id);
}